

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O1

void __thiscall sf::Text::draw(Text *this,RenderTarget *target)

{
  Transform *right;
  Texture *in_stack_00000060;
  
  if (this->m_font != (Font *)0x0) {
    ensureGeometryUpdate(this);
    right = Transformable::getTransform(&this->super_Transformable);
    operator*=((Transform *)&stack0x00000020,right);
    in_stack_00000060 = Font::getTexture(this->m_font,this->m_characterSize);
    if ((this->m_outlineThickness != 0.0) || (NAN(this->m_outlineThickness))) {
      RenderTarget::draw(target,&(this->m_outlineVertices).super_Drawable,
                         (RenderStates *)&stack0x00000008);
    }
    RenderTarget::draw(target,&(this->m_vertices).super_Drawable,(RenderStates *)&stack0x00000008);
  }
  return;
}

Assistant:

void Text::draw(RenderTarget& target, RenderStates states) const
{
    if (m_font)
    {
        ensureGeometryUpdate();

        states.transform *= getTransform();
        states.texture = &m_font->getTexture(m_characterSize);

        // Only draw the outline if there is something to draw
        if (m_outlineThickness != 0)
            target.draw(m_outlineVertices, states);

        target.draw(m_vertices, states);
    }
}